

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O0

void __thiscall VGMPlayer::~VGMPlayer(VGMPlayer *this)

{
  string *local_38;
  PCM_BANK *local_20;
  VGMPlayer *this_local;
  
  (this->super_PlayerBase)._vptr_PlayerBase = (_func_int **)&PTR__VGMPlayer_001eb178;
  (this->super_PlayerBase)._eventCbFunc = (PLAYER_EVENT_CB)0x0;
  if ((this->_playState & 1) != 0) {
    (*(this->super_PlayerBase)._vptr_PlayerBase[0x20])();
  }
  (*(this->super_PlayerBase)._vptr_PlayerBase[6])();
  if (this->_cpcUTF16 != (CPCONV *)0x0) {
    CPConv_Deinit(this->_cpcUTF16);
  }
  local_20 = (PCM_BANK *)&this->_pcmComprTbl;
  do {
    local_20 = local_20 + -1;
    PCM_BANK::~PCM_BANK(local_20);
  } while (local_20 != this->_pcmBank);
  std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::~vector
            (&this->_dacStreams);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->_devNames);
  std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::~vector
            (&this->_devices);
  std::vector<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>::~vector
            (&this->_devCfgs);
  local_38 = (string *)this->_tagList;
  do {
    local_38 = local_38 + -0x20;
    std::__cxx11::string::~string(local_38);
  } while (local_38 != (string *)&this->field_0x2f8);
  std::vector<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>::~vector
            (&this->_xHdrChipVol);
  std::vector<VGMPlayer::XHDR_DATA32,_std::allocator<VGMPlayer::XHDR_DATA32>_>::~vector
            (&this->_xHdrChipClk);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->_yrwRom);
  PlayerBase::~PlayerBase(&this->super_PlayerBase);
  return;
}

Assistant:

VGMPlayer::~VGMPlayer()
{
	_eventCbFunc = NULL;	// prevent any callbacks during destruction
	
	if (_playState & PLAYSTATE_PLAY)
		Stop();
	UnloadFile();
	
	if (_cpcUTF16 != NULL)
		CPConv_Deinit(_cpcUTF16);
	
	return;
}